

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase49::run(TestCase49 *this)

{
  Impl *pIVar1;
  long *plVar2;
  size_t sVar3;
  WirePointer *pWVar4;
  long lVar5;
  CapTableBuilder *pCVar6;
  undefined8 uVar7;
  Server *pSVar8;
  RequestHook *pRVar9;
  ClientHook *pCVar10;
  uint defaultPort;
  undefined8 *puVar11;
  WaitScope *__stat_loc;
  char *__n;
  size_t sVar12;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int __flags;
  Disposer *pDVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  Own<capnp::ClientHook> OVar18;
  Client CVar19;
  Reader RVar20;
  StringPtr bindAddress;
  StringPtr name;
  StringPtr name_00;
  StringPtr serverAddress;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  ReaderOptions readerOpts;
  ReaderOptions readerOpts_00;
  EzRpcServer server;
  int callCount;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  EzRpcClient client;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  EzRpcClient local_278;
  undefined1 local_268 [16];
  long *plStack_258;
  ArrayPtr<const_char> local_250;
  undefined8 *local_240;
  WirePointer *local_238;
  long local_230;
  Disposer *pDStack_228;
  RequestHook *local_220;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_218;
  long *local_1e0;
  int local_1d4;
  EzRpcServer local_1d0;
  int local_1bc;
  Own<capnp::Capability::Server> local_1b8;
  uint *local_1a0;
  short local_194;
  undefined4 local_190;
  undefined8 *local_188;
  long *local_180;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_170;
  undefined8 *local_138;
  long *plStack_130;
  EzRpcClient local_120;
  Client local_110;
  Client local_100;
  uint local_ec;
  undefined1 local_e8 [16];
  Server *pSStack_d8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_d0;
  Maybe<capnp::MessageSize> local_98;
  Maybe<capnp::MessageSize> local_80;
  Maybe<capnp::MessageSize> local_68;
  Maybe<capnp::MessageSize> local_50;
  Maybe<capnp::MessageSize> local_38;
  
  bindAddress.content.size_ = 10;
  bindAddress.content.ptr = "localhost";
  readerOpts._8_8_ = 0x40;
  readerOpts.traversalLimitInWords = 0x800000;
  EzRpcServer::EzRpcServer(&local_1d0,bindAddress,0,readerOpts);
  local_1bc = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_218,&local_1bc);
  local_1b8.disposer =
       (Disposer *)
       CONCAT44(local_218.super_Builder._builder.segment._4_4_,
                local_218.super_Builder._builder.segment._0_4_);
  local_1b8.ptr = (Server *)(local_218.super_Builder._builder.capTable + 2);
  if (local_218.super_Builder._builder.capTable == (CapTableBuilder *)0x0) {
    local_1b8.ptr = (Server *)0x0;
  }
  local_218.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  OVar18 = Capability::Client::makeLocalClient(&local_100,&local_1b8);
  pSVar8 = local_1b8.ptr;
  if (local_1b8.ptr != (Server *)0x0) {
    local_1b8.ptr = (Server *)0x0;
    (**(local_1b8.disposer)->_vptr_Disposer)
              (local_1b8.disposer,
               ((CapTableReader *)&pSVar8->_vptr_Server)->_vptr_CapTableReader[-2] +
               (long)&((CapTableReader *)&pSVar8->_vptr_Server)->_vptr_CapTableReader,OVar18.ptr);
  }
  name.content.size_ = 5;
  name.content.ptr = "cap1";
  EzRpcServer::exportCap(&local_1d0,name,&local_100);
  pCVar10 = local_100.hook.ptr;
  if (local_100.hook.ptr != (ClientHook *)0x0) {
    local_100.hook.ptr = (ClientHook *)0x0;
    (**(local_100.hook.disposer)->_vptr_Disposer)
              (local_100.hook.disposer,
               pCVar10->_vptr_ClientHook[-2] + (long)&pCVar10->_vptr_ClientHook);
  }
  pCVar6 = local_218.super_Builder._builder.capTable;
  if (local_218.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_218.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_218.super_Builder._builder.segment._4_4_,
                         local_218.super_Builder._builder.segment._0_4_))
              ((undefined8 *)
               CONCAT44(local_218.super_Builder._builder.segment._4_4_,
                        local_218.super_Builder._builder.segment._0_4_),
               (pCVar6->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar6->super_CapTableReader)._vptr_CapTableReader);
  }
  puVar11 = (undefined8 *)operator_new(0x20);
  local_1b8.ptr = (Server *)(puVar11 + 2);
  *puVar11 = 0;
  puVar11[1] = 0;
  puVar11[2] = 0;
  puVar11[3] = 0;
  *puVar11 = 0x611c58;
  puVar11[2] = 0x611c80;
  local_1b8.disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::TestCallOrderImpl>::instance;
  OVar18 = Capability::Client::makeLocalClient(&local_110,&local_1b8);
  pSVar8 = local_1b8.ptr;
  if (local_1b8.ptr != (Server *)0x0) {
    local_1b8.ptr = (Server *)0x0;
    (**(local_1b8.disposer)->_vptr_Disposer)
              (local_1b8.disposer,
               (_func_int *)((long)&pSVar8->_vptr_Server + (long)pSVar8->_vptr_Server[-2]),
               OVar18.ptr);
  }
  name_00.content.size_ = 5;
  name_00.content.ptr = "cap2";
  EzRpcServer::exportCap(&local_1d0,name_00,&local_110);
  pCVar10 = local_110.hook.ptr;
  if (local_110.hook.ptr != (ClientHook *)0x0) {
    local_110.hook.ptr = (ClientHook *)0x0;
    (**(local_110.hook.disposer)->_vptr_Disposer)
              (local_110.hook.disposer,
               pCVar10->_vptr_ClientHook[-2] + (long)&pCVar10->_vptr_ClientHook);
  }
  EzRpcServer::getPort((EzRpcServer *)&local_1b8);
  __stat_loc = EzRpcServer::getWaitScope(&local_1d0);
  defaultPort = kj::Promise<unsigned_int>::wait((Promise<unsigned_int> *)&local_1b8,__stat_loc);
  serverAddress.content.size_ = 10;
  serverAddress.content.ptr = "localhost";
  readerOpts_00._8_8_ = 0x40;
  readerOpts_00.traversalLimitInWords = 0x800000;
  __flags = 0x800000;
  EzRpcClient::EzRpcClient(&local_120,serverAddress,defaultPort,readerOpts_00);
  pSVar8 = local_1b8.ptr;
  if (local_1b8.ptr != (Server *)0x0) {
    local_1b8.ptr = (Server *)0x0;
    (**(local_1b8.disposer)->_vptr_Disposer)
              (local_1b8.disposer,
               (_func_int *)((long)&pSVar8->_vptr_Server + (long)pSVar8->_vptr_Server[-2]));
  }
  __n = (char *)0x5;
  name_01.content.size_ = (size_t)"cap1";
  name_01.content.ptr = (char *)&local_120;
  CVar19 = EzRpcClient::importCap((EzRpcClient *)&local_218,name_01);
  (*((local_218.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader[4])
            (&local_1b8,local_218.super_Builder._builder.capTable,CVar19.hook.ptr);
  pCVar6 = local_218.super_Builder._builder.capTable;
  local_e8._8_4_ = local_1b8.disposer._0_4_;
  local_e8._12_4_ = local_1b8.disposer._4_4_;
  pSStack_d8 = local_1b8.ptr;
  local_e8._0_8_ = &Capability::Client::typeinfo;
  if (local_218.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_218.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_218.super_Builder._builder.segment._4_4_,
                         local_218.super_Builder._builder.segment._0_4_))
              ((undefined8 *)
               CONCAT44(local_218.super_Builder._builder.segment._4_4_,
                        local_218.super_Builder._builder.segment._0_4_),
               (pCVar6->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar6->super_CapTableReader)._vptr_CapTableReader);
  }
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_d0,(Client *)local_e8,&local_38);
  *(undefined4 *)local_d0.super_Builder._builder.data = 0x7b;
  *(byte *)((long)local_d0.super_Builder._builder.data + 4) =
       *(byte *)((long)local_d0.super_Builder._builder.data + 4) | 1;
  __buf = extraout_RDX;
  if ((local_1bc != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_1b8.disposer = (Disposer *)((ulong)local_1b8.disposer & 0xffffffff00000000);
    __n = "\"failed: expected \" \"(0) == (callCount)\", 0, callCount";
    __flags = 0x4a9286;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_1b8,&local_1bc);
    __buf = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_218,(int)&local_d0,__buf,(size_t)__n,__flags);
  EzRpcServer::getWaitScope(&local_1d0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_1b8,&local_218);
  pDVar13 = local_218.hook.disposer;
  uVar7 = local_218.super_Builder._builder._32_8_;
  if (local_218.super_Builder._builder._32_8_ != 0) {
    local_218.super_Builder._builder.dataSize = 0;
    local_218.super_Builder._builder.pointerCount = 0;
    local_218.super_Builder._builder._38_2_ = 0;
    local_218.hook.disposer = (Disposer *)0x0;
    (**(local_218.hook.ptr)->_vptr_RequestHook)(local_218.hook.ptr,uVar7,8,pDVar13,pDVar13,0);
    __flags = (int)pDVar13;
  }
  pWVar4 = local_218.super_Builder._builder.pointers;
  if (local_218.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_218.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_218.super_Builder._builder.data)
              (local_218.super_Builder._builder.data,
               (long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
  }
  if (local_218.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_218.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_218.super_Builder._builder.segment._4_4_,
                         local_218.super_Builder._builder.segment._0_4_))();
  }
  bVar14 = local_194 == 0;
  local_218.super_Builder._builder.data = local_1a0;
  if (bVar14) {
    local_218.super_Builder._builder.data = (uint *)0x0;
  }
  uVar16 = 0x7fffffff;
  if (!bVar14) {
    uVar16 = local_190;
  }
  local_218.super_Builder._builder.segment._0_4_ = 0;
  local_218.super_Builder._builder.segment._4_4_ = 0;
  uVar15 = 0;
  uVar17 = 0;
  if (!bVar14) {
    local_218.super_Builder._builder.segment._0_4_ = local_1b8.disposer._0_4_;
    local_218.super_Builder._builder.segment._4_4_ = local_1b8.disposer._4_4_;
    uVar15 = local_1b8.ptr._0_4_;
    uVar17 = local_1b8.ptr._4_4_;
  }
  local_218.super_Builder._builder.capTable = (CapTableBuilder *)CONCAT44(uVar17,uVar15);
  local_218.super_Builder._builder.pointers._0_4_ = uVar16;
  RVar20 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_218,(void *)0x0,0);
  if (RVar20.super_StringPtr.content.size_ == 4) {
    if (((char)RVar20.super_StringPtr.content.ptr[1] != 'o' ||
        *RVar20.super_StringPtr.content.ptr != 0x6f66) && kj::_::Debug::minSeverity < 3)
    goto LAB_0031646e;
  }
  else {
    if (2 < kj::_::Debug::minSeverity) goto LAB_00316538;
LAB_0031646e:
    bVar14 = local_194 == 0;
    local_218.super_Builder._builder.data = local_1a0;
    if (bVar14) {
      local_218.super_Builder._builder.data = (uint *)0x0;
    }
    local_218.super_Builder._builder.pointers._0_4_ = 0x7fffffff;
    if (!bVar14) {
      local_218.super_Builder._builder.pointers._0_4_ = local_190;
    }
    local_218.super_Builder._builder.segment._0_4_ = 0;
    local_218.super_Builder._builder.segment._4_4_ = 0;
    uVar16 = 0;
    uVar15 = 0;
    if (!bVar14) {
      local_218.super_Builder._builder.segment._0_4_ = local_1b8.disposer._0_4_;
      local_218.super_Builder._builder.segment._4_4_ = local_1b8.disposer._4_4_;
      uVar16 = local_1b8.ptr._0_4_;
      uVar15 = local_1b8.ptr._4_4_;
    }
    local_218.super_Builder._builder.capTable = (CapTableBuilder *)CONCAT44(uVar15,uVar16);
    local_250 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)&local_218,(void *)0x0,0);
    __flags = 0x4aaa6e;
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x40,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (char (*) [4])0x4da3ec,(Reader *)&local_250);
  }
  if ((local_1bc != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_218.super_Builder._builder.segment._0_4_ = 1;
    __flags = 0x4ac0bd;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)&local_218,&local_1bc);
  }
LAB_00316538:
  sVar12 = 5;
  name_02.content.size_ = (size_t)"cap2";
  name_02.content.ptr = (char *)&local_120;
  CVar19 = EzRpcClient::importCap(&local_278,name_02);
  (*(code *)((local_278.impl.ptr)->context).disposer[4]._vptr_Disposer)
            (&local_138,local_278.impl.ptr,CVar19.hook.ptr);
  local_268._8_8_ = local_138;
  plStack_258 = plStack_130;
  local_268._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_170,(Client *)local_268,&local_50);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&local_250,(int)&local_170,__buf_00,sVar12,__flags);
  EzRpcServer::getWaitScope(&local_1d0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_218,&local_250);
  plVar2 = local_1e0;
  if (local_218.super_Builder._builder.dataSize < 0x20) {
    bVar14 = false;
  }
  else {
    bVar14 = *local_218.super_Builder._builder.data != 0;
  }
  if (local_1e0 != (long *)0x0) {
    local_1e0 = (long *)0x0;
    (**(local_218.hook.ptr)->_vptr_RequestHook)
              (local_218.hook.ptr,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pDVar13 = pDStack_228;
  lVar5 = local_230;
  if (local_230 != 0) {
    local_230 = 0;
    pDStack_228 = (Disposer *)0x0;
    (**local_220->_vptr_RequestHook)(local_220,lVar5,8,pDVar13,pDVar13,0);
    __flags = (int)pDVar13;
  }
  pWVar4 = local_238;
  if (local_238 != (WirePointer *)0x0) {
    local_238 = (WirePointer *)0x0;
    (**(code **)*local_240)
              (local_240,(long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
  }
  sVar3 = local_250.size_;
  if ((CapTableBuilder *)local_250.size_ != (CapTableBuilder *)0x0) {
    local_250.size_ = 0;
    (*(code *)((SegmentReader *)local_250.ptr)->arena->_vptr_Arena)
              (local_250.ptr,
               ((CapTableReader *)sVar3)->_vptr_CapTableReader[-2] +
               (long)&((CapTableReader *)sVar3)->_vptr_CapTableReader);
  }
  pRVar9 = local_170.hook.ptr;
  if (local_170.hook.ptr != (RequestHook *)0x0) {
    local_170.hook.ptr = (RequestHook *)0x0;
    (**(local_170.hook.disposer)->_vptr_Disposer)
              (local_170.hook.disposer,
               pRVar9->_vptr_RequestHook[-2] + (long)&pRVar9->_vptr_RequestHook);
  }
  plVar2 = plStack_258;
  if (plStack_258 != (long *)0x0) {
    plStack_258 = (long *)0x0;
    (*(code *)**(undefined8 **)local_268._8_8_)
              (local_268._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pIVar1 = local_278.impl.ptr;
  if (local_278.impl.ptr != (Impl *)0x0) {
    local_278.impl.ptr = (Impl *)0x0;
    (**(local_278.impl.disposer)->_vptr_Disposer)
              (local_278.impl.disposer,
               (long)&(pIVar1->context).disposer +
               (long)(pIVar1->context).disposer[-2]._vptr_Disposer);
  }
  if ((bool)(bVar14 & kj::_::Debug::minSeverity < 3)) {
    local_1d4 = 0;
    sVar12 = 5;
    name_03.content.size_ = (size_t)"cap2";
    name_03.content.ptr = (char *)&local_120;
    CVar19 = EzRpcClient::importCap(&local_278,name_03);
    (*(code *)((local_278.impl.ptr)->context).disposer[4]._vptr_Disposer)
              (&local_138,local_278.impl.ptr,CVar19.hook.ptr);
    local_268._8_8_ = local_138;
    plStack_258 = plStack_130;
    local_268._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
    local_68.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_170,(Client *)local_268,&local_68);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)&local_250,(int)&local_170,__buf_01,sVar12,__flags);
    EzRpcServer::getWaitScope(&local_1d0);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_218,&local_250);
    local_ec = 0;
    if (0x1f < local_218.super_Builder._builder.dataSize) {
      local_ec = *local_218.super_Builder._builder.data;
    }
    __flags = 0x4df520;
    kj::_::Debug::log<char_const(&)[149],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x44,ERROR,
               "\"failed: expected \" \"(0) == (client.importCap(\\\"cap2\\\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())\", 0, client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN()"
               ,(char (*) [149])
                "failed: expected (0) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
               ,&local_1d4,&local_ec);
    plVar2 = local_1e0;
    if (local_1e0 != (long *)0x0) {
      local_1e0 = (long *)0x0;
      (**(local_218.hook.ptr)->_vptr_RequestHook)
                (local_218.hook.ptr,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pDVar13 = pDStack_228;
    lVar5 = local_230;
    if (local_230 != 0) {
      local_230 = 0;
      pDStack_228 = (Disposer *)0x0;
      (**local_220->_vptr_RequestHook)(local_220,lVar5,8,pDVar13,pDVar13,0);
      __flags = (int)pDVar13;
    }
    pWVar4 = local_238;
    if (local_238 != (WirePointer *)0x0) {
      local_238 = (WirePointer *)0x0;
      (**(code **)*local_240)
                (local_240,(long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
    }
    sVar3 = local_250.size_;
    if ((CapTableBuilder *)local_250.size_ != (CapTableBuilder *)0x0) {
      local_250.size_ = 0;
      (*(code *)((SegmentReader *)local_250.ptr)->arena->_vptr_Arena)
                (local_250.ptr,
                 ((CapTableReader *)sVar3)->_vptr_CapTableReader[-2] +
                 (long)&((CapTableReader *)sVar3)->_vptr_CapTableReader);
    }
    pRVar9 = local_170.hook.ptr;
    if (local_170.hook.ptr != (RequestHook *)0x0) {
      local_170.hook.ptr = (RequestHook *)0x0;
      (**(local_170.hook.disposer)->_vptr_Disposer)
                (local_170.hook.disposer,
                 pRVar9->_vptr_RequestHook[-2] + (long)&pRVar9->_vptr_RequestHook);
    }
    plVar2 = plStack_258;
    if (plStack_258 != (long *)0x0) {
      plStack_258 = (long *)0x0;
      (*(code *)**(undefined8 **)local_268._8_8_)
                (local_268._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pIVar1 = local_278.impl.ptr;
    if (local_278.impl.ptr != (Impl *)0x0) {
      local_278.impl.ptr = (Impl *)0x0;
      (**(local_278.impl.disposer)->_vptr_Disposer)
                (local_278.impl.disposer,
                 (long)&(pIVar1->context).disposer +
                 (long)(pIVar1->context).disposer[-2]._vptr_Disposer);
    }
  }
  sVar12 = 5;
  name_04.content.size_ = (size_t)"cap2";
  name_04.content.ptr = (char *)&local_120;
  CVar19 = EzRpcClient::importCap(&local_278,name_04);
  (*(code *)((local_278.impl.ptr)->context).disposer[4]._vptr_Disposer)
            (&local_138,local_278.impl.ptr,CVar19.hook.ptr);
  local_268._8_8_ = local_138;
  plStack_258 = plStack_130;
  local_268._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_80.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_170,(Client *)local_268,&local_80);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&local_250,(int)&local_170,__buf_02,sVar12,__flags);
  EzRpcServer::getWaitScope(&local_1d0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_218,&local_250);
  plVar2 = local_1e0;
  bVar14 = true;
  if (0x1f < local_218.super_Builder._builder.dataSize) {
    bVar14 = *local_218.super_Builder._builder.data != 1;
  }
  if (local_1e0 != (long *)0x0) {
    local_1e0 = (long *)0x0;
    (**(local_218.hook.ptr)->_vptr_RequestHook)
              (local_218.hook.ptr,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pDVar13 = pDStack_228;
  lVar5 = local_230;
  if (local_230 != 0) {
    local_230 = 0;
    pDStack_228 = (Disposer *)0x0;
    (**local_220->_vptr_RequestHook)(local_220,lVar5,8,pDVar13,pDVar13,0);
    __flags = (int)pDVar13;
  }
  pWVar4 = local_238;
  if (local_238 != (WirePointer *)0x0) {
    local_238 = (WirePointer *)0x0;
    (**(code **)*local_240)
              (local_240,(long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
  }
  sVar3 = local_250.size_;
  if ((CapTableBuilder *)local_250.size_ != (CapTableBuilder *)0x0) {
    local_250.size_ = 0;
    (*(code *)((SegmentReader *)local_250.ptr)->arena->_vptr_Arena)
              (local_250.ptr,
               ((CapTableReader *)sVar3)->_vptr_CapTableReader[-2] +
               (long)&((CapTableReader *)sVar3)->_vptr_CapTableReader);
  }
  pRVar9 = local_170.hook.ptr;
  if (local_170.hook.ptr != (RequestHook *)0x0) {
    local_170.hook.ptr = (RequestHook *)0x0;
    (**(local_170.hook.disposer)->_vptr_Disposer)
              (local_170.hook.disposer,
               pRVar9->_vptr_RequestHook[-2] + (long)&pRVar9->_vptr_RequestHook);
  }
  plVar2 = plStack_258;
  if (plStack_258 != (long *)0x0) {
    plStack_258 = (long *)0x0;
    (*(code *)**(undefined8 **)local_268._8_8_)
              (local_268._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pIVar1 = local_278.impl.ptr;
  if (local_278.impl.ptr != (Impl *)0x0) {
    local_278.impl.ptr = (Impl *)0x0;
    (**(local_278.impl.disposer)->_vptr_Disposer)
              (local_278.impl.disposer,
               (long)&(pIVar1->context).disposer +
               (long)(pIVar1->context).disposer[-2]._vptr_Disposer);
  }
  if ((bool)(bVar14 & kj::_::Debug::minSeverity < 3)) {
    local_1d4 = 1;
    sVar12 = 5;
    name_05.content.size_ = (size_t)"cap2";
    name_05.content.ptr = (char *)&local_120;
    CVar19 = EzRpcClient::importCap(&local_278,name_05);
    (*(code *)((local_278.impl.ptr)->context).disposer[4]._vptr_Disposer)
              (&local_138,local_278.impl.ptr,CVar19.hook.ptr);
    local_268._8_8_ = local_138;
    plStack_258 = plStack_130;
    local_268._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
    local_98.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_170,(Client *)local_268,&local_98);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
            *)&local_250,(int)&local_170,__buf_03,sVar12,__flags);
    EzRpcServer::getWaitScope(&local_1d0);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_218,&local_250);
    local_ec = 0;
    if (0x1f < local_218.super_Builder._builder.dataSize) {
      local_ec = *local_218.super_Builder._builder.data;
    }
    kj::_::Debug::log<char_const(&)[149],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x46,ERROR,
               "\"failed: expected \" \"(1) == (client.importCap(\\\"cap2\\\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())\", 1, client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN()"
               ,(char (*) [149])
                "failed: expected (1) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
               ,&local_1d4,&local_ec);
    plVar2 = local_1e0;
    if (local_1e0 != (long *)0x0) {
      local_1e0 = (long *)0x0;
      (**(local_218.hook.ptr)->_vptr_RequestHook)
                (local_218.hook.ptr,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pDVar13 = pDStack_228;
    lVar5 = local_230;
    if (local_230 != 0) {
      local_230 = 0;
      pDStack_228 = (Disposer *)0x0;
      (**local_220->_vptr_RequestHook)(local_220,lVar5,8,pDVar13,pDVar13,0);
    }
    pWVar4 = local_238;
    if (local_238 != (WirePointer *)0x0) {
      local_238 = (WirePointer *)0x0;
      (**(code **)*local_240)
                (local_240,(long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
    }
    sVar3 = local_250.size_;
    if ((CapTableBuilder *)local_250.size_ != (CapTableBuilder *)0x0) {
      local_250.size_ = 0;
      (*(code *)((SegmentReader *)local_250.ptr)->arena->_vptr_Arena)
                (local_250.ptr,
                 ((CapTableReader *)sVar3)->_vptr_CapTableReader[-2] +
                 (long)&((CapTableReader *)sVar3)->_vptr_CapTableReader);
    }
    pRVar9 = local_170.hook.ptr;
    if (local_170.hook.ptr != (RequestHook *)0x0) {
      local_170.hook.ptr = (RequestHook *)0x0;
      (**(local_170.hook.disposer)->_vptr_Disposer)
                (local_170.hook.disposer,
                 pRVar9->_vptr_RequestHook[-2] + (long)&pRVar9->_vptr_RequestHook);
    }
    plVar2 = plStack_258;
    if (plStack_258 != (long *)0x0) {
      plStack_258 = (long *)0x0;
      (*(code *)**(undefined8 **)local_268._8_8_)
                (local_268._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pIVar1 = local_278.impl.ptr;
    if (local_278.impl.ptr != (Impl *)0x0) {
      local_278.impl.ptr = (Impl *)0x0;
      (**(local_278.impl.disposer)->_vptr_Disposer)
                (local_278.impl.disposer,
                 (long)&(pIVar1->context).disposer +
                 (long)(pIVar1->context).disposer[-2]._vptr_Disposer);
    }
  }
  plVar2 = local_180;
  if (local_180 != (long *)0x0) {
    local_180 = (long *)0x0;
    (**(code **)*local_188)(local_188,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pRVar9 = local_d0.hook.ptr;
  if (local_d0.hook.ptr != (RequestHook *)0x0) {
    local_d0.hook.ptr = (RequestHook *)0x0;
    (**(local_d0.hook.disposer)->_vptr_Disposer)
              (local_d0.hook.disposer,
               pRVar9->_vptr_RequestHook[-2] + (long)&pRVar9->_vptr_RequestHook);
  }
  pSVar8 = pSStack_d8;
  if (pSStack_d8 != (Server *)0x0) {
    pSStack_d8 = (Server *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_e8._12_4_,local_e8._8_4_))
              ((undefined8 *)CONCAT44(local_e8._12_4_,local_e8._8_4_),
               (_func_int *)((long)&pSVar8->_vptr_Server + (long)pSVar8->_vptr_Server[-2]));
  }
  EzRpcClient::~EzRpcClient(&local_120);
  EzRpcServer::~EzRpcServer(&local_1d0);
  return;
}

Assistant:

TEST(EzRpc, DeprecatedNames) {
  EzRpcServer server("localhost");
  int callCount = 0;
  server.exportCap("cap1", kj::heap<TestInterfaceImpl>(callCount));
  server.exportCap("cap2", kj::heap<TestCallOrderImpl>());

  EzRpcClient client("localhost", server.getPort().wait(server.getWaitScope()));

  auto cap = client.importCap<test::TestInterface>("cap1");
  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(server.getWaitScope());
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);

  EXPECT_EQ(0, client.importCap("cap2").castAs<test::TestCallOrder>()
      .getCallSequenceRequest().send().wait(server.getWaitScope()).getN());
  EXPECT_EQ(1, client.importCap("cap2").castAs<test::TestCallOrder>()
      .getCallSequenceRequest().send().wait(server.getWaitScope()).getN());
}